

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O1

void icu_63::double_conversion::TrimAndCut
               (Vector<const_char> buffer,int exponent,char *buffer_copy_space,int space_size,
               Vector<const_char> *trimmed,int *updated_exponent)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  undefined4 in_register_00000084;
  long lVar6;
  
  pcVar5 = buffer.start_;
  if (0 < buffer.length_) {
    uVar4 = 0;
    do {
      if (pcVar5[uVar4] != '0') {
        pcVar5 = pcVar5 + uVar4;
        iVar2 = buffer.length_ - (int)uVar4;
        goto LAB_0027f80e;
      }
      uVar4 = uVar4 + 1;
    } while ((buffer._8_8_ & 0xffffffff) != uVar4);
  }
  iVar2 = 0;
LAB_0027f80e:
  lVar6 = (long)iVar2;
  iVar3 = iVar2 + 1;
  do {
    if (lVar6 < 1) {
      iVar3 = 0;
      break;
    }
    iVar3 = iVar3 + -1;
    lVar1 = lVar6 + -1;
    lVar6 = lVar6 + -1;
  } while (pcVar5[lVar1] == '0');
  iVar2 = (iVar2 - iVar3) + exponent;
  if (iVar3 < 0x30d) {
    *(char **)CONCAT44(in_register_00000084,space_size) = pcVar5;
    *(int *)(CONCAT44(in_register_00000084,space_size) + 8) = iVar3;
    *(int *)&trimmed->start_ = iVar2;
    return;
  }
  lVar6 = 0;
  do {
    buffer_copy_space[lVar6] = pcVar5[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x30b);
  buffer_copy_space[0x30b] = '1';
  *(int *)&trimmed->start_ = iVar2 + iVar3 + -0x30c;
  *(char **)CONCAT44(in_register_00000084,space_size) = buffer_copy_space;
  *(undefined4 *)(CONCAT44(in_register_00000084,space_size) + 8) = 0x30c;
  return;
}

Assistant:

static Vector<const char> TrimLeadingZeros(Vector<const char> buffer) {
  for (int i = 0; i < buffer.length(); i++) {
    if (buffer[i] != '0') {
      return buffer.SubVector(i, buffer.length());
    }
  }
  return Vector<const char>(buffer.start(), 0);
}